

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

uint * cimg_library::cimg::exception_mode(uint value,bool is_set)

{
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,is_set) != 0) {
    if (Mutex_attr()::val == '\0') {
      exception_mode();
    }
    pthread_mutex_lock((pthread_mutex_t *)Mutex_attr()::val);
    exception_mode::mode = 4;
    if (value < 4) {
      exception_mode::mode = value;
    }
    if (Mutex_attr()::val == '\0') {
      exception_mode();
    }
    pthread_mutex_unlock((pthread_mutex_t *)Mutex_attr()::val);
  }
  return &exception_mode::mode;
}

Assistant:

inline unsigned int& exception_mode(const unsigned int value, const bool is_set) {
      static unsigned int mode = cimg_verbosity;
      if (is_set) { cimg::mutex(0); mode = value<4?value:4; cimg::mutex(0,0); }
      return mode;
    }